

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Sintatico::programa(Sintatico *this)

{
  this->line = 1;
  avancar(this);
  while (((uint)this->tok < 0x18 && ((0x980000U >> (this->tok & 0x1fU) & 1) != 0))) {
    avancar(this);
  }
  eat(this,0x27);
  identificador(this);
  eat(this,0x15);
  while (((uint)this->tok < 0x18 && ((0x980000U >> (this->tok & 0x1fU) & 1) != 0))) {
    avancar(this);
  }
  bloco(this);
  while (((uint)this->tok < 0x18 && ((0x980000U >> (this->tok & 0x1fU) & 1) != 0))) {
    avancar(this);
  }
  eat(this,0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"COMPILATION SUCcESS\n",0x14);
  return;
}

Assistant:

void Sintatico::programa(){
  line = 1;
  avancar();
  saltBlank();
  eat(PROGRAM);
  identificador();
  eat(PONTOVIRGULA);
  saltBlank();
  bloco();
  saltBlank();
  eat(PONTO);
  cout << "COMPILATION SUCcESS\n";
}